

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-pipe-connect-prepare.c
# Opt level: O1

int run_test_pipe_connect_on_prepare(void)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int extraout_EAX_02;
  uv_loop_t *puVar2;
  uv_loop_t *unaff_RBX;
  int iVar3;
  uv_prepare_t *puVar4;
  uv_handle_t *handle;
  int64_t eval_b;
  int64_t eval_a;
  undefined1 auStack_30 [16];
  undefined8 uStack_20;
  uv__queue *local_18;
  uv__queue *local_10;
  
  iVar3 = (int)&local_18;
  uStack_20._0_4_ = 0x1adf82;
  uStack_20._4_4_ = 0;
  puVar2 = uv_default_loop();
  uStack_20._0_4_ = 0x1adf93;
  uStack_20._4_4_ = 0;
  iVar1 = uv_pipe_init(puVar2,&pipe_handle,0);
  local_10 = (uv__queue *)(long)iVar1;
  local_18 = (uv__queue *)0x0;
  if (local_10 == (uv__queue *)0x0) {
    uStack_20._0_4_ = 0x1adfb6;
    uStack_20._4_4_ = 0;
    puVar2 = uv_default_loop();
    uStack_20._0_4_ = 0x1adfc5;
    uStack_20._4_4_ = 0;
    iVar1 = uv_prepare_init(puVar2,&prepare_handle);
    local_10 = (uv__queue *)(long)iVar1;
    local_18 = (uv__queue *)0x0;
    if (local_10 != (uv__queue *)0x0) goto LAB_001ae0eb;
    uStack_20._0_4_ = 0x1adff6;
    uStack_20._4_4_ = 0;
    iVar1 = uv_prepare_start(&prepare_handle,prepare_cb);
    local_10 = (uv__queue *)(long)iVar1;
    local_18 = (uv__queue *)0x0;
    if (local_10 != (uv__queue *)0x0) goto LAB_001ae0f8;
    uStack_20._0_4_ = 0x1ae019;
    uStack_20._4_4_ = 0;
    puVar2 = uv_default_loop();
    uStack_20._0_4_ = 0x1ae023;
    uStack_20._4_4_ = 0;
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    local_10 = (uv__queue *)(long)iVar1;
    local_18 = (uv__queue *)0x0;
    if (local_10 != (uv__queue *)0x0) goto LAB_001ae105;
    local_10 = (uv__queue *)0x2;
    local_18 = (uv__queue *)(long)close_cb_called;
    if (local_18 != (uv__queue *)0x2) goto LAB_001ae112;
    local_10 = (uv__queue *)0x1;
    local_18 = (uv__queue *)(long)connect_cb_called;
    if (local_18 == (uv__queue *)0x1) {
      uStack_20._0_4_ = 0x1ae08c;
      uStack_20._4_4_ = 0;
      unaff_RBX = uv_default_loop();
      uStack_20._0_4_ = 0x1ae0a0;
      uStack_20._4_4_ = 0;
      uv_walk(unaff_RBX,close_walk_cb,(void *)0x0);
      uStack_20._0_4_ = 0x1ae0aa;
      uStack_20._4_4_ = 0;
      uv_run(unaff_RBX,UV_RUN_DEFAULT);
      local_10 = (uv__queue *)0x0;
      uStack_20._0_4_ = 0x1ae0b8;
      uStack_20._4_4_ = 0;
      puVar2 = uv_default_loop();
      uStack_20._0_4_ = 0x1ae0c0;
      uStack_20._4_4_ = 0;
      iVar1 = uv_loop_close(puVar2);
      local_18 = (uv__queue *)(long)iVar1;
      if (local_10 == local_18) {
        uStack_20._0_4_ = 0x1ae0d6;
        uStack_20._4_4_ = 0;
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001ae12c;
    }
  }
  else {
    uStack_20._0_4_ = 0x1ae0eb;
    uStack_20._4_4_ = 0;
    run_test_pipe_connect_on_prepare_cold_1();
LAB_001ae0eb:
    uStack_20._0_4_ = 0x1ae0f8;
    uStack_20._4_4_ = 0;
    run_test_pipe_connect_on_prepare_cold_2();
LAB_001ae0f8:
    uStack_20._0_4_ = 0x1ae105;
    uStack_20._4_4_ = 0;
    run_test_pipe_connect_on_prepare_cold_3();
LAB_001ae105:
    uStack_20._0_4_ = 0x1ae112;
    uStack_20._4_4_ = 0;
    run_test_pipe_connect_on_prepare_cold_4();
LAB_001ae112:
    uStack_20._0_4_ = 0x1ae11f;
    uStack_20._4_4_ = 0;
    run_test_pipe_connect_on_prepare_cold_5();
  }
  uStack_20._0_4_ = 0x1ae12c;
  uStack_20._4_4_ = 0;
  run_test_pipe_connect_on_prepare_cold_6();
LAB_001ae12c:
  puVar4 = (uv_prepare_t *)&stack0xfffffffffffffff0;
  uStack_20 = (uv_prepare_t *)prepare_cb;
  run_test_pipe_connect_on_prepare_cold_7();
  if (puVar4 == &prepare_handle) {
    uv_pipe_connect(&conn_req,&pipe_handle,"/path/to/unix/socket/that/really/should/not/be/there",
                    connect_cb);
    return extraout_EAX;
  }
  uStack_20 = &prepare_handle;
  auStack_30._8_8_ = connect_cb;
  prepare_cb_cold_1();
  auStack_30._0_8_ = SEXT48(iVar3);
  auStack_30._8_8_ = unaff_RBX;
  if ((void *)auStack_30._0_8_ == (void *)0xfffffffffffffffe) {
    connect_cb_called = connect_cb_called + 1;
    uv_close((uv_handle_t *)&prepare_handle,close_cb);
    uv_close((uv_handle_t *)&pipe_handle,close_cb);
    return extraout_EAX_00;
  }
  handle = (uv_handle_t *)auStack_30;
  connect_cb_cold_1();
  if (handle != (uv_handle_t *)0x0) {
    close_cb_called = close_cb_called + 1;
    return extraout_EAX_01;
  }
  close_cb_cold_1();
  iVar1 = uv_is_closing(handle);
  if (iVar1 != 0) {
    return iVar1;
  }
  uv_close(handle,(uv_close_cb)0x0);
  return extraout_EAX_02;
}

Assistant:

TEST_IMPL(pipe_connect_on_prepare) {
  int r;

  r = uv_pipe_init(uv_default_loop(), &pipe_handle, 0);
  ASSERT_OK(r);

  r = uv_prepare_init(uv_default_loop(), &prepare_handle);
  ASSERT_OK(r);
  r = uv_prepare_start(&prepare_handle, prepare_cb);
  ASSERT_OK(r);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT_OK(r);

  ASSERT_EQ(2, close_cb_called);
  ASSERT_EQ(1, connect_cb_called);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}